

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::CmpHelperNearFloatingPoint<float>
          (char *expr1,char *expr2,char *absc,float val1,float val2,float abs_v)

{
  bool bVar1;
  AssertionResult *pAVar2;
  AssertionResult *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float diff;
  floating_point<float> f2;
  floating_point<float> f1;
  FInt local_88;
  float local_84;
  float local_80;
  float local_7c;
  char *local_78;
  char *local_70;
  char *local_68;
  _Myt local_60;
  FInt local_5c;
  string local_58;
  AssertionResult local_38;
  
  local_88.uv = ~-(uint)(in_XMM1_Da < in_XMM0_Da) & (uint)(in_XMM1_Da - in_XMM0_Da) |
                (uint)(in_XMM0_Da - in_XMM1_Da) & -(uint)(in_XMM1_Da < in_XMM0_Da);
  if ((in_XMM2_Da <= local_88.fv) &&
     (local_5c.uv = local_88.uv,
     bVar1 = floating_point<float>::AlmostEquals((floating_point<float> *)&local_5c,&local_60),
     !bVar1)) {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_38,(char (*) [22])"error: Value of: abs(");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_68);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [6])") <= ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_78);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"\n  Actual: abs(");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_7c);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_80);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])") : ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_88.fv);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\nExpected: ");
    PrintToString<float>(&local_58,&local_84);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_58);
    AssertionResult::AssertionResult(in_RDI,pAVar2);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    return in_RDI;
  }
  (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
  (in_RDI->m_message)._M_string_length = 0;
  (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
  in_RDI->m_result = true;
  return in_RDI;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNearFloatingPoint(
    const char* expr1, const char* expr2, const char* absc
        , RawType val1, RawType val2, RawType abs_v)
{
    const RawType diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff < abs_v )
    {
        return AssertionSuccess();
    }